

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O1

string * google::protobuf::compiler::csharp::ToCSharpName
                   (string *__return_storage_ptr__,string *name,FileDescriptor *file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string classname;
  string result;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  GetFileNamespace_abi_cxx11_(&local_80,(csharp *)file,file);
  if (local_80._M_string_length != 0) {
    std::__cxx11::string::push_back((char)&local_80);
  }
  paVar1 = &local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  if (*(long *)(*(long *)(file + 8) + 8) == 0) {
    std::__cxx11::string::_M_assign((string *)&local_a0);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)name);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,".","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,".Types.","");
  StringReplace(&local_c0,&local_a0,&local_40,&local_60,true);
  std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_c0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::operator+(__return_storage_ptr__,"global::",&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToCSharpName(const std::string& name, const FileDescriptor* file) {
  std::string result = GetFileNamespace(file);
  if (!result.empty()) {
    result += '.';
  }
  string classname;
  if (file->package().empty()) {
    classname = name;
  } else {
    // Strip the proto package from full_name since we've replaced it with
    // the C# namespace.
    classname = name.substr(file->package().size() + 1);
  }
  result += StringReplace(classname, ".", ".Types.", true);
  return "global::" + result;
}